

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * google::protobuf::compiler::php::anon_unknown_2::PhpName
                   (string *__return_storage_ptr__,string *full_name,Options *options)

{
  char cVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string segment;
  string local_50;
  
  if (options->is_descriptor == true) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&kDescriptorPackageName_abi_cxx11_);
  }
  else {
    segment._M_dataplus._M_p = (pointer)&segment.field_2;
    segment._M_string_length = 0;
    segment.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    for (uVar2 = 0; uVar2 < full_name->_M_string_length; uVar2 = uVar2 + 1) {
      cVar1 = (full_name->_M_dataplus)._M_p[uVar2];
      if ((cVar1 < 'a') && (cVar1 == '.')) {
        ClassNamePrefix(&local_50,&segment);
        std::operator+(&local_b0,&local_50,&segment);
        std::operator+(&local_90,&local_b0,'\\');
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::assign((char *)&segment);
      }
      else {
        std::__cxx11::string::push_back((char)&segment);
      }
    }
    ClassNamePrefix(&local_b0,&segment);
    std::operator+(&local_90,&local_b0,&segment);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&segment);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PhpName(const std::string& full_name, const Options& options) {
  if (options.is_descriptor) {
    return kDescriptorPackageName;
  }

  std::string segment;
  std::string result;
  bool cap_next_letter = true;
  for (int i = 0; i < full_name.size(); i++) {
    if ('a' <= full_name[i] && full_name[i] <= 'z' && cap_next_letter) {
      segment += full_name[i] + ('A' - 'a');
      cap_next_letter = false;
    } else if (full_name[i] == '.') {
      result += ClassNamePrefix(segment) + segment + '\\';
      segment = "";
      cap_next_letter = true;
    } else {
      segment += full_name[i];
      cap_next_letter = false;
    }
  }
  result += ClassNamePrefix(segment) + segment;
  return result;
}